

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-chat.cpp
# Opt level: O1

int32_t llama_chat_builtin_templates(char **output,size_t len)

{
  size_t sVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  
  sVar1 = LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count < len) {
    len = LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if (len != 0) {
    sVar3 = 0;
    p_Var2 = LLM_CHAT_TEMPLATES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      output[sVar3] = *(char **)(p_Var2 + 1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  return (int32_t)sVar1;
}

Assistant:

int32_t llama_chat_builtin_templates(const char ** output, size_t len) {
    auto it = LLM_CHAT_TEMPLATES.begin();
    for (size_t i = 0; i < std::min(len, LLM_CHAT_TEMPLATES.size()); i++) {
        output[i] = it->first.c_str();
        std::advance(it, 1);
    }
    return (int32_t) LLM_CHAT_TEMPLATES.size();
}